

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O3

void __thiscall
chrono::fea::ChTetrahedronFace::LoadableGetVariables
          (ChTetrahedronFace *this,
          vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *mvars)

{
  pointer *pppCVar1;
  iterator __position;
  int iVar2;
  ChLoadableUV local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  ChVariables *local_30;
  
  iVar2 = 0;
  do {
    GetNodeN((ChTetrahedronFace *)&local_40,(int)this);
    local_30 = (ChVariables *)(**(code **)(*(long *)local_40 + 0x40))();
    __position._M_current =
         (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (mvars->super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,
                 __position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppCVar1 = &(mvars->
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  return;
}

Assistant:

virtual void LoadableGetVariables(std::vector<ChVariables*>& mvars) override {
        for (int i = 0; i < 3; ++i)
            mvars.push_back(&GetNodeN(i)->Variables());
    }